

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O1

TldAsKey * __thiscall TldAsKey::CreateCopy(TldAsKey *this)

{
  uint8_t uVar1;
  uint32_t uVar2;
  TldAsKey *pTVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t uVar6;
  
  pTVar3 = (TldAsKey *)operator_new(0x70);
  uVar4 = this->tld_len;
  uVar2 = this->max_name_parts;
  pTVar3->HashNext = (TldAsKey *)0x0;
  pTVar3->MoreRecentKey = (TldAsKey *)0x0;
  pTVar3->LessRecentKey = (TldAsKey *)0x0;
  pTVar3->max_name_parts = uVar2;
  pTVar3->count = 1;
  pTVar3->hash = 0;
  uVar5 = 0x40;
  if (uVar4 < 0x40) {
    uVar5 = uVar4;
  }
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      uVar1 = this->tld[uVar4];
      uVar6 = uVar1 + 0xe0;
      if (0x19 < (byte)(uVar1 + 0x9f)) {
        uVar6 = uVar1;
      }
      pTVar3->tld[uVar4] = uVar6;
      uVar4 = uVar4 + 1;
    } while (uVar5 != uVar4);
  }
  pTVar3->tld_len = uVar4;
  pTVar3->tld[uVar4] = '\0';
  pTVar3->count = this->count;
  return pTVar3;
}

Assistant:

TldAsKey * TldAsKey::CreateCopy()
{
    TldAsKey * ret = new TldAsKey(this->tld, this->tld_len, this->max_name_parts);

    if (ret != NULL)
    {
        ret->count = count;
    }

    return ret;
}